

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool stringToId(char *input,PolicyID *pid)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long local_50;
  long id;
  undefined1 auStack_40 [4];
  int i;
  string_view local_30;
  PolicyID *local_20;
  PolicyID *pid_local;
  char *input_local;
  
  local_20 = pid;
  pid_local = (PolicyID *)input;
  if (input == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmPolicies.cxx"
                  ,0x17,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  sVar3 = strlen(input);
  if (sVar3 == 7) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,(char *)pid_local);
    bVar1 = cmHasLiteralPrefix<4ul>(local_30,(char (*) [4])"CMP");
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_40,(char *)pid_local);
      bVar1 = cmHasLiteralSuffix<5ul>(_auStack_40,(char (*) [5])0xc1909b);
      if (bVar1) {
        *local_20 = CMP0000;
        input_local._7_1_ = true;
      }
      else {
        for (id._4_4_ = 3; id._4_4_ < 7; id._4_4_ = id._4_4_ + 1) {
          iVar2 = isdigit((int)*(char *)((long)pid_local + (long)id._4_4_));
          if (iVar2 == 0) {
            return false;
          }
        }
        bVar1 = cmStrToLong((char *)((long)pid_local + 3),&local_50);
        if (bVar1) {
          if (local_50 < 0x8f) {
            *local_20 = (PolicyID)local_50;
            input_local._7_1_ = true;
          }
          else {
            input_local._7_1_ = false;
          }
        }
        else {
          input_local._7_1_ = false;
        }
      }
    }
    else {
      input_local._7_1_ = false;
    }
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

static bool stringToId(const char* input, cmPolicies::PolicyID& pid)
{
  assert(input);
  if (strlen(input) != 7) {
    return false;
  }
  if (!cmHasLiteralPrefix(input, "CMP")) {
    return false;
  }
  if (cmHasLiteralSuffix(input, "0000")) {
    pid = cmPolicies::CMP0000;
    return true;
  }
  for (int i = 3; i < 7; ++i) {
    if (!isdigit(*(input + i))) {
      return false;
    }
  }
  long id;
  if (!cmStrToLong(input + 3, &id)) {
    return false;
  }
  if (id >= cmPolicies::CMPCOUNT) {
    return false;
  }
  pid = static_cast<cmPolicies::PolicyID>(id);
  return true;
}